

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::bindFramebuffer(ReferenceContext *this,deUint32 target,deUint32 name)

{
  deBool dVar1;
  deUint32 dVar2;
  Attachment *pAVar3;
  Framebuffer **local_60;
  AttachmentPoint local_48;
  AttachmentPoint local_44;
  int point_1;
  int point;
  Framebuffer **binding;
  int local_30;
  deUint32 bindingTarget;
  int ndx;
  Framebuffer *local_20;
  Framebuffer *fbo;
  deUint32 name_local;
  deUint32 target_local;
  ReferenceContext *this_local;
  
  local_20 = (Framebuffer *)0x0;
  while (((target == 0x8d40 || (target == 0x8ca9)) || (target == 0x8ca8))) {
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      if ((name != 0) &&
         (local_20 = rc::ObjectManager<sglr::rc::Framebuffer>::find(&this->m_framebuffers,name),
         local_20 == (Framebuffer *)0x0)) {
        local_20 = (Framebuffer *)operator_new(0x50);
        rc::Framebuffer::Framebuffer(local_20,name);
        rc::ObjectManager<sglr::rc::Framebuffer>::insert(&this->m_framebuffers,local_20);
      }
      for (local_30 = 0; local_30 < 2; local_30 = local_30 + 1) {
        dVar2 = 0x8ca8;
        if (local_30 == 0) {
          local_60 = &this->m_readFramebufferBinding;
        }
        else {
          dVar2 = 0x8ca9;
          local_60 = &this->m_drawFramebufferBinding;
        }
        if ((target == 0x8d40) || (target == dVar2)) {
          if (*local_60 != (Framebuffer *)0x0) {
            for (local_44 = ATTACHMENTPOINT_COLOR0; (int)local_44 < 3;
                local_44 = local_44 + ATTACHMENTPOINT_DEPTH) {
              pAVar3 = rc::Framebuffer::getAttachment(*local_60,local_44);
              releaseFboAttachmentReference(this,pAVar3);
            }
            rc::ObjectManager<sglr::rc::Framebuffer>::releaseReference
                      (&this->m_framebuffers,*local_60);
          }
          if (local_20 != (Framebuffer *)0x0) {
            rc::ObjectManager<sglr::rc::Framebuffer>::acquireReference
                      (&this->m_framebuffers,local_20);
            for (local_48 = ATTACHMENTPOINT_COLOR0; (int)local_48 < 3;
                local_48 = local_48 + ATTACHMENTPOINT_DEPTH) {
              pAVar3 = rc::Framebuffer::getAttachment(local_20,local_48);
              acquireFboAttachmentReference(this,pAVar3);
            }
          }
          *local_60 = local_20;
        }
      }
      return;
    }
  }
  setError(this,0x500);
  return;
}

Assistant:

void ReferenceContext::bindFramebuffer (deUint32 target, deUint32 name)
{
	Framebuffer* fbo = DE_NULL;

	RC_IF_ERROR(target != GL_FRAMEBUFFER		&&
				target != GL_DRAW_FRAMEBUFFER	&&
				target != GL_READ_FRAMEBUFFER, GL_INVALID_ENUM, RC_RET_VOID);

	if (name != 0)
	{
		// Find or create framebuffer object.
		fbo = m_framebuffers.find(name);
		if (!fbo)
		{
			fbo = new Framebuffer(name);
			m_framebuffers.insert(fbo);
		}
	}

	for (int ndx = 0; ndx < 2; ndx++)
	{
		deUint32			bindingTarget	= ndx ? GL_DRAW_FRAMEBUFFER			: GL_READ_FRAMEBUFFER;
		rc::Framebuffer*&	binding			= ndx ? m_drawFramebufferBinding	: m_readFramebufferBinding;

		if (target != GL_FRAMEBUFFER && target != bindingTarget)
			continue; // Doesn't match this target.

		// Remove old references
		if (binding)
		{
			// Clear all attachment point references
			for (int point = 0; point < Framebuffer::ATTACHMENTPOINT_LAST; point++)
				releaseFboAttachmentReference(binding->getAttachment((Framebuffer::AttachmentPoint)point));

			m_framebuffers.releaseReference(binding);
		}

		// Create new references
		if (fbo)
		{
			m_framebuffers.acquireReference(fbo);

			for (int point = 0; point < Framebuffer::ATTACHMENTPOINT_LAST; point++)
				acquireFboAttachmentReference(fbo->getAttachment((Framebuffer::AttachmentPoint)point));
		}

		binding = fbo;
	}
}